

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

int handle_pragma(dmr_C *C,stream *stream,token **line,token *token)

{
  token *ptVar1;
  int iVar2;
  token *next;
  token *token_local;
  token **line_local;
  stream *stream_local;
  dmr_C *C_local;
  
  ptVar1 = *line;
  iVar2 = dmrC_match_ident(token->next,C->S->once_ident);
  if ((iVar2 == 0) || (token->next->next != &dmrC_eof_token_entry_)) {
    token->field_2 = (anon_union_8_7_c7bfca54_for_token_2)C->S->pragma_ident;
    token->pos = (position)((ulong)token->pos & 0xffffffffffefffff | 0x100000);
    token->pos = (position)((ulong)token->pos & 0xffffffffffdfffff | 0x200000);
    token->pos = (position)((ulong)token->pos & 0xffffffff003fffff | 0x400000);
    *line = token;
    token->next = ptVar1;
    C_local._4_4_ = 0;
  }
  else {
    stream->once = 1;
    C_local._4_4_ = 1;
  }
  return C_local._4_4_;
}

Assistant:

static int handle_pragma(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
	struct token *next = *line;

	if (dmrC_match_ident(token->next, C->S->once_ident) && dmrC_eof_token(token->next->next)) {
		stream->once = 1;
		return 1;
	}
	token->ident = C->S->pragma_ident;
	token->pos.newline = 1;
	token->pos.whitespace = 1;
	token->pos.pos = 1;
	*line = token;
	token->next = next;
	return 0;
}